

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
passLocalOptions(HighsLogOptions *report_log_options,HighsOptions *from_options,
                HighsOptions *to_options)

{
  HighsOptionType HVar1;
  OptionStatus OVar2;
  size_type sVar3;
  reference ppOVar4;
  const_reference ppOVar5;
  long in_RDX;
  long in_RSI;
  OptionRecordString *in_RDI;
  bool bVar6;
  string value_6;
  double value_5;
  HighsInt value_4;
  bool value_3;
  HighsOptionType type_1;
  HighsInt index_1;
  string value_2;
  double value_1;
  HighsInt value;
  HighsOptionType type;
  HighsInt index;
  HighsInt num_options;
  OptionStatus return_status;
  undefined4 in_stack_fffffffffffffeb8;
  OptionStatus in_stack_fffffffffffffebc;
  OptionRecordString *in_stack_fffffffffffffec0;
  HighsLogOptions *in_stack_fffffffffffffec8;
  OptionRecordInt *in_stack_fffffffffffffed0;
  HighsLogOptions *in_stack_fffffffffffffed8;
  OptionRecordDouble *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  OptionStatus in_stack_fffffffffffffeec;
  string local_e8 [32];
  string local_c8 [16];
  string *in_stack_ffffffffffffff48;
  OptionRecordString *in_stack_ffffffffffffff50;
  HighsLogOptions *in_stack_ffffffffffffff58;
  undefined4 local_94;
  string local_80 [32];
  string local_60 [32];
  _func_int *local_40;
  undefined4 local_34;
  HighsOptionType local_30;
  int local_2c;
  int local_28;
  OptionStatus local_24;
  long local_20;
  long local_18;
  OptionRecordString *local_10;
  OptionStatus local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::size
                    ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(in_RDX + 0x3e0));
  local_28 = (int)sVar3;
  for (local_2c = 0; local_2c < local_28; local_2c = local_2c + 1) {
    ppOVar4 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                         (local_20 + 0x3e0),(long)local_2c);
    local_30 = (*ppOVar4)->type;
    if (local_30 == kInt) {
      ppOVar5 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           (local_18 + 0x3e0),(long)local_2c);
      local_34 = *(undefined4 *)(*ppOVar5)[1]._vptr_OptionRecord;
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)local_2c);
      OVar2 = checkOptionValue(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                               (HighsInt)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if (OVar2 != kOk) {
        return OVar2;
      }
      local_24 = kOk;
    }
    else if (local_30 == kDouble) {
      ppOVar5 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           (local_18 + 0x3e0),(long)local_2c);
      local_40 = *(*ppOVar5)[1]._vptr_OptionRecord;
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)local_2c);
      OVar2 = checkOptionValue((HighsLogOptions *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                               in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
      if (OVar2 != kOk) {
        return OVar2;
      }
      local_24 = kOk;
    }
    else if (local_30 == kString) {
      ppOVar5 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           (local_18 + 0x3e0),(long)local_2c);
      std::__cxx11::string::string(local_60,(string *)(*ppOVar5)[1]._vptr_OptionRecord);
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)local_2c);
      std::__cxx11::string::string(local_80,local_60);
      in_stack_fffffffffffffeec =
           checkOptionValue(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                            (string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))
      ;
      local_24 = in_stack_fffffffffffffeec;
      std::__cxx11::string::~string(local_80);
      bVar6 = local_24 != kOk;
      if (bVar6) {
        local_4 = local_24;
      }
      std::__cxx11::string::~string(local_60);
      if (bVar6) {
        return local_4;
      }
    }
  }
  local_94 = 0;
  do {
    if (local_28 <= (int)local_94) {
      return kOk;
    }
    ppOVar4 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                         (local_20 + 0x3e0),(long)(int)local_94);
    HVar1 = (*ppOVar4)->type;
    if (HVar1 == kBool) {
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_18 + 0x3e0),
                 (long)(int)local_94);
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)(int)local_94);
      OVar2 = setLocalOptionValue((OptionRecordBool *)in_stack_fffffffffffffec0,
                                  SUB41(in_stack_fffffffffffffebc >> 0x18,0));
      if (OVar2 != kOk) {
        return OVar2;
      }
      local_24 = kOk;
    }
    else if (HVar1 == kInt) {
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_18 + 0x3e0),
                 (long)(int)local_94);
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)(int)local_94);
      OVar2 = setLocalOptionValue(in_stack_fffffffffffffec8,
                                  (OptionRecordInt *)in_stack_fffffffffffffec0,
                                  in_stack_fffffffffffffebc);
      if (OVar2 != kOk) {
        return OVar2;
      }
      local_24 = kOk;
    }
    else if (HVar1 == kDouble) {
      ppOVar5 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           (local_18 + 0x3e0),(long)(int)local_94);
      in_stack_ffffffffffffff58 = (HighsLogOptions *)*(*ppOVar5)[1]._vptr_OptionRecord;
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)(int)local_94);
      OVar2 = setLocalOptionValue(in_stack_fffffffffffffec8,
                                  (OptionRecordDouble *)in_stack_fffffffffffffec0,
                                  (double)CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8));
      if (OVar2 != kOk) {
        return OVar2;
      }
      local_24 = kOk;
    }
    else {
      ppOVar5 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           (local_18 + 0x3e0),(long)(int)local_94);
      in_stack_fffffffffffffec8 = (HighsLogOptions *)local_c8;
      std::__cxx11::string::string
                ((string *)in_stack_fffffffffffffec8,(string *)(*ppOVar5)[1]._vptr_OptionRecord);
      in_stack_fffffffffffffec0 = local_10;
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)(local_20 + 0x3e0),
                 (long)(int)local_94);
      std::__cxx11::string::string(local_e8,(string *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffebc =
           setLocalOptionValue(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff48);
      local_24 = in_stack_fffffffffffffebc;
      std::__cxx11::string::~string(local_e8);
      bVar6 = local_24 != kOk;
      if (bVar6) {
        local_4 = local_24;
      }
      std::__cxx11::string::~string(local_c8);
      if (bVar6) {
        return local_4;
      }
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

OptionStatus passLocalOptions(const HighsLogOptions& report_log_options,
                              const HighsOptions& from_options,
                              HighsOptions& to_options) {
  // (Attempt to) set option value from the HighsOptions passed in
  OptionStatus return_status;
  //  std::string empty_file = "";
  //  std::string from_log_file = from_options.log_file;
  //  std::string original_to_log_file = to_options.log_file;
  //  FILE* original_to_log_stream =
  //  to_options.log_options.log_stream;
  HighsInt num_options = to_options.records.size();
  // Check all the option values before setting any of them - in case
  // to_options are the main Highs options. Checks are only needed for
  // HighsInt, double and string since bool values can't be illegal
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kString) {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  // Checked from_options and found it to be OK, so set all the values
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kBool) {
      bool value = *(((OptionRecordBool*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          ((OptionRecordBool*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  /*
  if (from_log_file.compare(original_to_log_file)) {
    // The log file name has changed
    if (from_options.log_options.log_stream &&
        !original_to_log_file.compare(empty_file)) {
      // The stream corresponding to from_log_file is non-null and the
      // original log file name was empty, so to_options inherits the
      // stream, but associated with the (necessarily) non-empty name
      // from_log_file
      //
      // This ensures that the stream to Highs.log opened in
      // RunHighs.cpp is retained unless the log file name is changed.
      assert(from_log_file.compare(empty_file));
      assert(!original_to_log_stream);
      to_options.log_options.log_stream =
          from_options.log_options.log_stream;
    } else {
      highsOpenLogFile(to_options, to_options.log_file);
    }
  }
  */
  return OptionStatus::kOk;
}